

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int refs_from_header(refs_t *r,cram_fd *fd,SAM_hdr *h)

{
  kh_refs_t *h_00;
  khint_t kVar1;
  undefined8 in_RAX;
  ref_entry **pprVar2;
  ref_entry *prVar3;
  char *pcVar4;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  undefined8 uStack_38;
  int n;
  
  iVar9 = 0;
  if ((fd != (cram_fd *)0x0) && (iVar9 = 0, (long)*(int *)&fd->ctr != 0)) {
    uStack_38 = in_RAX;
    pprVar2 = (ref_entry **)realloc(r->ref_id,((long)r->nref + (long)*(int *)&fd->ctr) * 8);
    r->ref_id = pprVar2;
    iVar9 = -1;
    if (pprVar2 != (ref_entry **)0x0) {
      iVar9 = r->nref;
      lVar7 = 0;
      for (lVar6 = 0; lVar6 < *(int *)&fd->ctr; lVar6 = lVar6 + 1) {
        h_00 = r->h_meta;
        kVar1 = kh_get_refs(h_00,*(kh_cstr_t *)(*(long *)&fd->first_base + lVar7));
        if (kVar1 == h_00->n_buckets) {
          prVar3 = (ref_entry *)calloc(1,0x38);
          lVar8 = (long)iVar9;
          r->ref_id[lVar8] = prVar3;
          if ((prVar3 == (ref_entry *)0x0) ||
             (*(long *)(*(long *)&fd->first_base + lVar8 * 0x20) == 0)) {
            return -1;
          }
          pcVar4 = string_dup(r->pool,*(char **)(*(long *)&fd->first_base + lVar7));
          pprVar2 = r->ref_id;
          pprVar2[lVar8]->name = pcVar4;
          pprVar2[lVar8]->length = 0;
          type = sam_hdr_find((SAM_hdr *)fd,"SQ","SN",*(char **)(*(long *)&fd->first_base + lVar7));
          if ((type != (SAM_hdr_type *)0x0) &&
             (pSVar5 = sam_hdr_find_key((SAM_hdr *)fd,type,"M5",(SAM_hdr_tag **)0x0),
             pSVar5 != (SAM_hdr_tag *)0x0)) {
            pcVar4 = string_dup(r->pool,pSVar5->str + 3);
            r->ref_id[lVar8]->fn = pcVar4;
          }
          kVar1 = kh_put_refs(r->h_meta,r->ref_id[lVar8]->name,&n);
          if (n < 1) {
            return -1;
          }
          r->h_meta->vals[kVar1] = r->ref_id[lVar8];
          iVar9 = iVar9 + 1;
        }
        lVar7 = lVar7 + 0x20;
      }
      r->nref = iVar9;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int refs_from_header(refs_t *r, cram_fd *fd, SAM_hdr *h) {
    int i, j;

    if (!h || h->nref == 0)
	return 0;

    //fprintf(stderr, "refs_from_header for %p mode %c\n", fd, fd->mode);

    /* Existing refs are fine, as long as they're compatible with the hdr. */
    if (!(r->ref_id = realloc(r->ref_id, (r->nref + h->nref) * sizeof(*r->ref_id))))
	return -1;

    /* Copy info from h->ref[i] over to r */
    for (i = 0, j = r->nref; i < h->nref; i++) {
	SAM_hdr_type *ty;
	SAM_hdr_tag *tag;
	khint_t k;
	int n;

	k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta))
	    // Ref already known about
	    continue;

	if (!(r->ref_id[j] = calloc(1, sizeof(ref_entry))))
	    return -1;

	if (!h->ref[j].name)
	    return -1;

	r->ref_id[j]->name = string_dup(r->pool, h->ref[i].name);
	r->ref_id[j]->length = 0; // marker for not yet loaded

	/* Initialise likely filename if known */
	if ((ty = sam_hdr_find(h, "SQ", "SN", h->ref[i].name))) {
	    if ((tag = sam_hdr_find_key(h, ty, "M5", NULL))) {
		r->ref_id[j]->fn = string_dup(r->pool, tag->str+3);
		//fprintf(stderr, "Tagging @SQ %s / %s\n", r->ref_id[h]->name, r->ref_id[h]->fn);
	    }
	}

	k = kh_put(refs, r->h_meta, r->ref_id[j]->name, &n);
	if (n <= 0) // already exists or error
	    return -1;
	kh_val(r->h_meta, k) = r->ref_id[j];

	j++;
    }
    r->nref = j;

    return 0;
}